

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  FieldsByNumberSet *common;
  ctrl_t *pcVar1;
  Descriptor *pDVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *prVar3;
  uint uVar4;
  long lVar5;
  ushort uVar6;
  undefined1 auVar7 [16];
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  undefined1 uVar24;
  ushort uVar26;
  uintptr_t v;
  bool bVar25;
  size_t sVar27;
  slot_type *ppFVar28;
  anon_union_8_1_a8a14541_for_iterator_2 aVar29;
  undefined1 (*pauVar30) [16];
  uintptr_t v_4;
  char *__function;
  HeapOrSoo *pHVar31;
  size_t cap_2;
  long lVar32;
  ulong uVar33;
  ctrl_t *pcVar34;
  undefined **c;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *prVar35;
  uint uVar36;
  uint64_t v_11;
  Descriptor *in_R9;
  uintptr_t v_8;
  uintptr_t v_24;
  ulong uVar37;
  CommonFields *common_00;
  ulong uVar38;
  size_t cap_6;
  undefined **ppuVar39;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i match;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  FindInfo target;
  iterator iVar53;
  iterator iVar54;
  HeapOrSoo *local_c0;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  ctrl_t cVar40;
  char cVar41;
  ctrl_t cVar45;
  char cVar46;
  ctrl_t cVar47;
  char cVar48;
  ctrl_t cVar49;
  char cVar50;
  
  pDVar2 = field->containing_type_;
  if (((pDVar2 != (Descriptor *)0x0) && (uVar36 = field->number_, 0 < (int)uVar36)) &&
     (uVar36 <= pDVar2->sequential_field_limit_)) {
    if ((field->field_0x1 & 8) != 0) {
      return false;
    }
    if ((int)uVar36 <= pDVar2->field_count_) {
      return pDVar2->fields_ + (uVar36 - 1) == field;
    }
    AddFieldByNumber();
LAB_001551d4:
    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x79d,
                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                 );
  }
  common = &this->fields_by_number_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)(this->fields_by_number_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar37 = ((ulong)field->containing_type_ ^ 0x44ba38) * -0x234dd359734ecb13;
    uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
               (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
               (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28
              | uVar37 << 0x38) ^ (ulong)field->containing_type_) * -0x234dd359734ecb13;
    uVar37 = (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
              (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
              (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28 |
             uVar37 << 0x38) ^ (ulong)(uint)field->number_;
    prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)(common->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (prVar35 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)0x1) {
      ppFVar28 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      pDVar2 = (*ppFVar28)->containing_type_;
      if ((field->containing_type_ == pDVar2) &&
         (uVar36 = (*ppFVar28)->number_, field->number_ == uVar36)) {
        uVar38 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
        uVar38 = ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                   (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                   (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                   (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)pDVar2) *
                 -0x234dd359734ecb13;
        if (uVar37 != ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                        (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                        (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                        (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)uVar36)) {
LAB_00154acc:
          __function = 
          "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::AssertHashEqConsistent(google::protobuf::FieldDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
          ;
          goto LAB_00154ff5;
        }
      }
    }
    else {
      if (prVar35 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x0) goto LAB_001551f3;
      if (prVar35 < (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)0x11) {
        lVar32 = *(long *)((long)&(this->fields_by_number_).
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::slot_array(prVar35);
        uVar38 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar30 = (undefined1 (*) [16])
                   (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar38 < 0xf) {
          if (8 < uVar38) goto LAB_0015526f;
          uVar38 = *(ulong *)(*pauVar30 + uVar38) & 0x8080808080808080;
          if (uVar38 != 0x8080808080808080) {
            uVar38 = uVar38 ^ 0x8080808080808080;
            pDVar2 = field->containing_type_;
            uVar33 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
            uVar33 = ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                       (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                       (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                       (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)pDVar2) *
                     -0x234dd359734ecb13;
            do {
              lVar5 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              lVar5 = *(long *)(lVar32 + -8 + (ulong)((uint)lVar5 & 0xfffffff8));
              if (((pDVar2 == *(Descriptor **)(lVar5 + 0x20)) &&
                  (field->number_ == *(uint *)(lVar5 + 4))) &&
                 (uVar37 != ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                              (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                              (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                              (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^
                            (ulong)(uint)field->number_))) goto LAB_00154acc;
              uVar38 = uVar38 & uVar38 - 1;
            } while (uVar38 != 0);
          }
        }
        else {
          uVar38 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar38) {
            uVar38 = uVar38 >> 1;
            do {
              auVar42 = *pauVar30;
              uVar36 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar42[0xf] >> 7) << 0xf);
              if (uVar36 != 0xffff) {
                uVar36 = ~uVar36;
                do {
                  uVar4 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                    }
                  }
                  if ((char)(*pauVar30)[uVar4] < '\0') goto LAB_001551d4;
                  lVar5 = *(long *)(lVar32 + (ulong)uVar4 * 8);
                  in_R9 = *(Descriptor **)(lVar5 + 0x20);
                  if ((field->containing_type_ == in_R9) &&
                     (uVar4 = *(uint *)(lVar5 + 4), field->number_ == uVar4)) {
                    uVar33 = ((ulong)in_R9 ^ 0x44ba38) * -0x234dd359734ecb13;
                    uVar33 = ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                               (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                               (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                               (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)in_R9) *
                             -0x234dd359734ecb13;
                    if (uVar37 != ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                                    (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8
                                    | (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                                    (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)uVar4))
                    goto LAB_00154acc;
                  }
                  uVar38 = uVar38 - 1;
                  uVar26 = (ushort)(uVar36 - 1) & (ushort)uVar36;
                  uVar36 = CONCAT22((short)(uVar36 - 1 >> 0x10),uVar26);
                } while (uVar26 != 0);
                if (uVar38 == 0) goto LAB_001547a6;
              }
              pauVar30 = pauVar30 + 1;
              lVar32 = lVar32 + 0x80;
            } while (auVar42[0xf] != 0xff);
            goto LAB_001551a8;
          }
        }
      }
    }
  }
LAB_001547a6:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)(common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ).settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)(common->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
  if (prVar35 ==
      (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       *)0x1) {
    if ((this->fields_by_number_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_
        < 2) {
      absl::lts_20250127::container_internal::CommonFields::AssertInSooMode((CommonFields *)common);
      (this->fields_by_number_).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           2;
      aVar29.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::soo_slot(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
      iVar53.field_1.slot_ = aVar29.slot_;
      iVar53.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
    }
    else {
      ppFVar28 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      if (((*ppFVar28)->containing_type_ == field->containing_type_) &&
         ((*ppFVar28)->number_ == field->number_)) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::soo_slot(&common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  );
        return false;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::resize_impl(common,3);
      uVar37 = ((ulong)field->containing_type_ ^ 0x44ba38) * -0x234dd359734ecb13;
      uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)field->containing_type_) *
               -0x234dd359734ecb13;
      uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)(uint)field->number_) *
               -0x234dd359734ecb13;
      sVar27 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                         (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                          (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                          (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                          (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38,8,(CommonFields *)common);
      iVar53 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator_at(&common->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ,sVar27);
    }
LAB_00154c2e:
    aVar29 = iVar53.field_1;
    c = (undefined **)
        (this->fields_by_number_).
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_;
    (this->fields_by_number_).
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0xffffffffffffff9c;
    *aVar29.slot_ = field;
    absl::lts_20250127::container_internal::CommonFields::set_capacity
              ((CommonFields *)common,(size_t)c);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::iterator::operator*((iterator *)iVar53.ctrl_);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(this->fields_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_);
    if (1 < (this->fields_by_number_).
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      pDVar2 = (*aVar29.slot_)->containing_type_;
      uVar37 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
      uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)pDVar2) * -0x234dd359734ecb13;
      ppuVar39 = (undefined **)
                 ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                   (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                   (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                   (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^
                 (ulong)(uint)(*aVar29.slot_)->number_);
      prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)(common->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ).settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
      if (prVar35 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x1) {
        ppFVar28 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::soo_slot(&common->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             );
        pDVar2 = (*ppFVar28)->containing_type_;
        if (((*aVar29.slot_)->containing_type_ == pDVar2) &&
           (uVar36 = (*ppFVar28)->number_, (*aVar29.slot_)->number_ == uVar36)) {
          uVar37 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
          uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                     (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                     (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                     (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)pDVar2) *
                   -0x234dd359734ecb13;
          if (ppuVar39 !=
              (undefined **)
              ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 | (uVar37 & 0xff00) << 0x28
               | uVar37 << 0x38) ^ (ulong)uVar36)) {
LAB_00154fe0:
            __function = 
            "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::AssertHashEqConsistent(const google::protobuf::FieldDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
            ;
LAB_00154ff5:
            __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xfbf,__function);
          }
        }
      }
      else {
        if (prVar35 ==
            (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)0x0) goto LAB_001551f3;
        if (prVar35 < (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)0x11) {
          lVar32 = *(long *)((long)&(this->fields_by_number_).
                                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    .settings_.
                                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                    .
                                    super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                    .value.heap_or_soo_ + 8);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::slot_array(prVar35);
          uVar37 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
          pauVar30 = (undefined1 (*) [16])
                     (this->fields_by_number_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.control;
          if (uVar37 < 0xf) {
            if (8 < uVar37) {
LAB_0015526f:
              __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x78b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
            uVar37 = *(ulong *)(*pauVar30 + uVar37) & 0x8080808080808080;
            if (uVar37 != 0x8080808080808080) {
              uVar37 = uVar37 ^ 0x8080808080808080;
              uVar36 = (*aVar29.slot_)->number_;
              pDVar2 = (*aVar29.slot_)->containing_type_;
              uVar38 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
              uVar38 = ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                         (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                         (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                         (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)pDVar2) *
                       -0x234dd359734ecb13;
              c = (undefined **)
                  ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                    (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                    (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                    (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)uVar36);
              do {
                lVar5 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                lVar5 = *(long *)(lVar32 + -8 + (ulong)((uint)lVar5 & 0xfffffff8));
                if (((pDVar2 == *(Descriptor **)(lVar5 + 0x20)) && (uVar36 == *(uint *)(lVar5 + 4)))
                   && (ppuVar39 != c)) goto LAB_00154fe0;
                uVar37 = uVar37 & uVar37 - 1;
              } while (uVar37 != 0);
            }
          }
          else {
            uVar37 = (this->fields_by_number_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.size_;
            if (1 < uVar37) {
              uVar37 = uVar37 >> 1;
              c = &absl::lts_20250127::hash_internal::MixingHashState::kSeed;
              do {
                auVar42 = *pauVar30;
                uVar36 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(byte)(auVar42[0xf] >> 7) << 0xf);
                if (uVar36 != 0xffff) {
                  uVar36 = ~uVar36;
                  do {
                    uVar4 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                      }
                    }
                    if ((char)(*pauVar30)[uVar4] < '\0') goto LAB_001551d4;
                    lVar5 = *(long *)(lVar32 + (ulong)uVar4 * 8);
                    pDVar2 = *(Descriptor **)(lVar5 + 0x20);
                    if (((*aVar29.slot_)->containing_type_ == pDVar2) &&
                       (uVar4 = *(uint *)(lVar5 + 4), (*aVar29.slot_)->number_ == uVar4)) {
                      uVar38 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
                      uVar38 = ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                                 (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                                 (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                                 (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)pDVar2) *
                               -0x234dd359734ecb13;
                      if (ppuVar39 !=
                          (undefined **)
                          ((uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                            (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                            (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                            (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38) ^ (ulong)uVar4))
                      goto LAB_00154fe0;
                    }
                    uVar37 = uVar37 - 1;
                    uVar26 = (ushort)(uVar36 - 1) & (ushort)uVar36;
                    uVar36 = CONCAT22((short)(uVar36 - 1 >> 0x10),uVar26);
                  } while (uVar26 != 0);
                  if (uVar37 == 0) goto LAB_00154c62;
                }
                pauVar30 = pauVar30 + 1;
                lVar32 = lVar32 + 0x80;
              } while (auVar42[0xf] != 0xff);
LAB_001551a8:
              __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7a5,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                           );
            }
          }
        }
      }
    }
LAB_00154c62:
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(common->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ).settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_);
    prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)(common->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (prVar35 ==
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)0x1) {
      prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)0x1;
      if (1 < (this->fields_by_number_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .size_) {
        ppFVar28 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::soo_slot(&common->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             );
        if (((*ppFVar28)->containing_type_ == (*aVar29.slot_)->containing_type_) &&
           ((*ppFVar28)->number_ == (*aVar29.slot_)->number_)) {
          aVar29.slot_ = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ::soo_slot(&common->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   );
          iVar54.field_1.slot_ = aVar29.slot_;
          iVar54.ctrl_ = absl::lts_20250127::container_internal::kSooControl;
          goto LAB_00155017;
        }
        prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)(common->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ).settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::AssertNotDebugCapacity(prVar35);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = c;
      iVar54 = (iterator)(auVar42 << 0x40);
LAB_00155017:
      bVar25 = absl::lts_20250127::container_internal::operator==
                         ((const_iterator *)iVar54.ctrl_,(const_iterator *)iVar54.field_1.slot_);
      if (!bVar25) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfe2,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, Args = <google::protobuf::FieldDescriptor *const &>]"
                     );
      }
      return true;
    }
    if (prVar35 !=
        (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)0x0) {
      pcVar34 = (this->fields_by_number_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.control;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::prefetch_heap_block(prVar35);
      prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)(this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.capacity_;
      if (prVar35 ==
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                     );
      }
      if (prVar35 !=
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)0x0) {
        if (((ulong)((long)&(prVar35->settings_).
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_ + 1U) & (ulong)prVar35) != 0) goto LAB_00155212;
        pDVar2 = (*aVar29.slot_)->containing_type_;
        uVar37 = ((ulong)pDVar2 ^ 0x44ba38) * -0x234dd359734ecb13;
        uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                   (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                   (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                   (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)pDVar2) *
                 -0x234dd359734ecb13;
        uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                   (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                   (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                   (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^
                 (ulong)(uint)(*aVar29.slot_)->number_) * -0x234dd359734ecb13;
        pcVar1 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        uVar38 = (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                  (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                  (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                  (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) >> 7 ^ (ulong)pcVar1 >> 0xc;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::control(prVar35);
        uVar24 = (undefined1)(uVar37 >> 0x38);
        auVar42 = ZEXT216(CONCAT11(uVar24,uVar24) & 0x7f7f);
        auVar42 = pshuflw(auVar42,auVar42,0);
        pHVar31 = (HeapOrSoo *)0x0;
        while( true ) {
          uVar38 = uVar38 & (ulong)prVar35;
          pauVar30 = (undefined1 (*) [16])(pcVar1 + uVar38);
          local_88 = (*pauVar30)[0];
          cStack_87 = (*pauVar30)[1];
          cStack_86 = (*pauVar30)[2];
          cStack_85 = (*pauVar30)[3];
          cStack_84 = (*pauVar30)[4];
          cStack_83 = (*pauVar30)[5];
          cStack_82 = (*pauVar30)[6];
          cStack_81 = (*pauVar30)[7];
          cStack_80 = (*pauVar30)[8];
          cStack_7f = (*pauVar30)[9];
          cStack_7e = (*pauVar30)[10];
          cStack_7d = (*pauVar30)[0xb];
          cStack_7c = (*pauVar30)[0xc];
          cStack_7b = (*pauVar30)[0xd];
          cStack_7a = (*pauVar30)[0xe];
          cStack_79 = (*pauVar30)[0xf];
          auVar43 = *pauVar30;
          cVar41 = auVar42[0];
          auVar44[0] = -(cVar41 == local_88);
          cVar46 = auVar42[1];
          auVar44[1] = -(cVar46 == cStack_87);
          cVar48 = auVar42[2];
          auVar44[2] = -(cVar48 == cStack_86);
          cVar50 = auVar42[3];
          auVar44[3] = -(cVar50 == cStack_85);
          auVar44[4] = -(cVar41 == cStack_84);
          auVar44[5] = -(cVar46 == cStack_83);
          auVar44[6] = -(cVar48 == cStack_82);
          auVar44[7] = -(cVar50 == cStack_81);
          auVar44[8] = -(cVar41 == cStack_80);
          auVar44[9] = -(cVar46 == cStack_7f);
          auVar44[10] = -(cVar48 == cStack_7e);
          auVar44[0xb] = -(cVar50 == cStack_7d);
          auVar44[0xc] = -(cVar41 == cStack_7c);
          auVar44[0xd] = -(cVar46 == cStack_7b);
          auVar44[0xe] = -(cVar48 == cStack_7a);
          auVar44[0xf] = -(cVar50 == cStack_79);
          uVar26 = (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar44[0xf] >> 7) << 0xf;
          uVar36 = (uint)uVar26;
          while (uVar26 != 0) {
            uVar4 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            lVar32 = *(long *)((long)&(this->fields_by_number_).
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      .settings_.
                                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                      .
                                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                      .value.heap_or_soo_ + 8);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)(this->fields_by_number_).
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            .settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_);
            uVar37 = uVar4 + uVar38 & (ulong)prVar35;
            lVar32 = *(long *)(lVar32 + uVar37 * 8);
            if ((*(Descriptor **)(lVar32 + 0x20) == (*aVar29.slot_)->containing_type_) &&
               (*(int *)(lVar32 + 4) == (*aVar29.slot_)->number_)) {
              iVar54 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::iterator_at(&common->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ,uVar37);
              goto LAB_00155017;
            }
            uVar26 = (ushort)(uVar36 - 1) & (ushort)uVar36;
            uVar36 = CONCAT22((short)(uVar36 - 1 >> 0x10),uVar26);
            local_88 = auVar43[0];
            cStack_87 = auVar43[1];
            cStack_86 = auVar43[2];
            cStack_85 = auVar43[3];
            cStack_84 = auVar43[4];
            cStack_83 = auVar43[5];
            cStack_82 = auVar43[6];
            cStack_81 = auVar43[7];
            cStack_80 = auVar43[8];
            cStack_7f = auVar43[9];
            cStack_7e = auVar43[10];
            cStack_7d = auVar43[0xb];
            cStack_7c = auVar43[0xc];
            cStack_7b = auVar43[0xd];
            cStack_7a = auVar43[0xe];
            cStack_79 = auVar43[0xf];
          }
          auVar52[0] = -(local_88 == -0x80);
          auVar52[1] = -(cStack_87 == -0x80);
          auVar52[2] = -(cStack_86 == -0x80);
          auVar52[3] = -(cStack_85 == -0x80);
          auVar52[4] = -(cStack_84 == -0x80);
          auVar52[5] = -(cStack_83 == -0x80);
          auVar52[6] = -(cStack_82 == -0x80);
          auVar52[7] = -(cStack_81 == -0x80);
          auVar52[8] = -(cStack_80 == -0x80);
          auVar52[9] = -(cStack_7f == -0x80);
          auVar52[10] = -(cStack_7e == -0x80);
          auVar52[0xb] = -(cStack_7d == -0x80);
          auVar52[0xc] = -(cStack_7c == -0x80);
          auVar52[0xd] = -(cStack_7b == -0x80);
          auVar52[0xe] = -(cStack_7a == -0x80);
          auVar52[0xf] = -(cStack_79 == -0x80);
          prVar3 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)(common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ).settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_;
          if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar52 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar52 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar52 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar52 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar52 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar52 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar52 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar52 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar52 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cStack_79 == -0x80) break;
          if (prVar3 == (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)0x0) goto LAB_001551f3;
          uVar38 = (long)pHVar31 + uVar38 + 0x10;
          pHVar31 = pHVar31 + 1;
          if (prVar3 < pHVar31) {
            __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe37,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                         );
          }
        }
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::AssertNotDebugCapacity(prVar3);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pcVar34;
        iVar54 = (iterator)(auVar7 << 0x40);
        goto LAB_00155017;
      }
    }
  }
  else if (prVar35 !=
           (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block(prVar35);
    prVar35 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)(this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (((ulong)((long)&(prVar35->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + 1U) & (ulong)prVar35) == 0) {
      uVar37 = ((ulong)field->containing_type_ ^ 0x44ba38) * -0x234dd359734ecb13;
      uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)field->containing_type_) *
               -0x234dd359734ecb13;
      uVar37 = ((uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                 (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                 (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                 (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38) ^ (ulong)(uint)field->number_) *
               -0x234dd359734ecb13;
      common_00 = (CommonFields *)
                  (uVar37 >> 0x38 | (uVar37 & 0xff000000000000) >> 0x28 |
                   (uVar37 & 0xff0000000000) >> 0x18 | (uVar37 & 0xff00000000) >> 8 |
                   (uVar37 & 0xff000000) << 8 | (uVar37 & 0xff0000) << 0x18 |
                   (uVar37 & 0xff00) << 0x28 | uVar37 << 0x38);
      pcVar34 = (this->fields_by_number_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.control;
      uVar38 = (ulong)common_00 >> 7 ^ (ulong)pcVar34 >> 0xc;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::control(prVar35);
      uVar24 = (undefined1)(uVar37 >> 0x38);
      auVar42 = ZEXT216(CONCAT11(uVar24,uVar24) & 0x7f7f);
      auVar42 = pshuflw(auVar42,auVar42,0);
      local_c0 = (HeapOrSoo *)0x0;
LAB_00154868:
      uVar38 = uVar38 & (ulong)prVar35;
      pcVar1 = pcVar34 + uVar38;
      cVar8 = *pcVar1;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      cVar40 = auVar42[0];
      auVar43[0] = -(cVar40 == cVar8);
      cVar45 = auVar42[1];
      auVar43[1] = -(cVar45 == cVar9);
      cVar47 = auVar42[2];
      auVar43[2] = -(cVar47 == cVar10);
      cVar49 = auVar42[3];
      auVar43[3] = -(cVar49 == cVar11);
      auVar43[4] = -(cVar40 == cVar12);
      auVar43[5] = -(cVar45 == cVar13);
      auVar43[6] = -(cVar47 == cVar14);
      auVar43[7] = -(cVar49 == cVar15);
      auVar43[8] = -(cVar40 == cVar16);
      auVar43[9] = -(cVar45 == cVar17);
      auVar43[10] = -(cVar47 == cVar18);
      auVar43[0xb] = -(cVar49 == cVar19);
      auVar43[0xc] = -(cVar40 == cVar20);
      auVar43[0xd] = -(cVar45 == cVar21);
      auVar43[0xe] = -(cVar47 == cVar22);
      auVar43[0xf] = -(cVar49 == cVar23);
      uVar26 = (ushort)(SUB161(auVar43 >> 7,0) & 1) | (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe | (ushort)(auVar43[0xf] >> 7) << 0xf;
      uVar36 = (uint)uVar26;
      while (uVar26 != 0) {
        uVar4 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        lVar32 = *(long *)((long)&(this->fields_by_number_).
                                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  .settings_.
                                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)(this->fields_by_number_).
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_);
        uVar37 = uVar4 + uVar38 & (ulong)prVar35;
        lVar32 = *(long *)(lVar32 + uVar37 * 8);
        if ((*(Descriptor **)(lVar32 + 0x20) == field->containing_type_) &&
           (*(int *)(lVar32 + 4) == field->number_)) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::iterator_at(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ,uVar37);
          return false;
        }
        uVar26 = (ushort)(uVar36 - 1) & (ushort)uVar36;
        uVar36 = CONCAT22((short)(uVar36 - 1 >> 0x10),uVar26);
      }
      auVar51[0] = -(cVar8 == kEmpty);
      auVar51[1] = -(cVar9 == kEmpty);
      auVar51[2] = -(cVar10 == kEmpty);
      auVar51[3] = -(cVar11 == kEmpty);
      auVar51[4] = -(cVar12 == kEmpty);
      auVar51[5] = -(cVar13 == kEmpty);
      auVar51[6] = -(cVar14 == kEmpty);
      auVar51[7] = -(cVar15 == kEmpty);
      auVar51[8] = -(cVar16 == kEmpty);
      auVar51[9] = -(cVar17 == kEmpty);
      auVar51[10] = -(cVar18 == kEmpty);
      auVar51[0xb] = -(cVar19 == kEmpty);
      auVar51[0xc] = -(cVar20 == kEmpty);
      auVar51[0xd] = -(cVar21 == kEmpty);
      auVar51[0xe] = -(cVar22 == kEmpty);
      auVar51[0xf] = -(cVar23 == kEmpty);
      uVar26 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
      prVar3 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(common->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ).settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
      if (uVar26 == 0) {
        if (prVar3 != (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)0x0) goto code_r0x00154918;
      }
      else if (prVar3 != (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)0x0) {
        pcVar34 = (this->fields_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::control(prVar3);
        bVar25 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                           ((size_t)prVar3,(size_t)common_00,pcVar34);
        if (bVar25) {
          uVar6 = 0xf;
          if (uVar26 != 0) {
            for (; uVar26 >> uVar6 == 0; uVar6 = uVar6 - 1) {
            }
          }
          uVar36 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
        }
        else {
          uVar36 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
        }
        target.probe_length =
             (size_t)absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                     ::GetPolicyFunctions()::value;
        target.offset = (size_t)local_c0;
        sVar27 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                           ((container_internal *)common,common_00,uVar36 + uVar38 & (ulong)prVar35,
                            target,(PolicyFunctions *)in_R9);
        iVar53 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::iterator_at(&common->
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ,sVar27);
        goto LAB_00154c2e;
      }
      goto LAB_001551f3;
    }
LAB_00155212:
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
LAB_001551f3:
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
               );
code_r0x00154918:
  uVar38 = (long)local_c0 + uVar38 + 0x10;
  local_c0 = local_c0 + 1;
  if (prVar3 < local_c0) {
    __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf7d,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::FieldDescriptor *]"
                 );
  }
  goto LAB_00154868;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(FieldDescriptor* field) {
  // Skip fields that are at the start of the sequence.
  if (field->containing_type() != nullptr && field->number() >= 1 &&
      field->number() <= field->containing_type()->sequential_field_limit_) {
    if (field->is_extension()) {
      // Conflicts with the field that already exists in the sequential range.
      return false;
    }
    // Only return true if the field at that index matches. Otherwise it
    // conflicts with the existing field in the sequential range.
    return field->containing_type()->field(field->number() - 1) == field;
  }

  return fields_by_number_.insert(field).second;
}